

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-to-source.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  uint *puVar1;
  pointer ppVar2;
  size_t sVar3;
  _Base_ptr p_Var4;
  char cVar5;
  Module *pMVar6;
  long *plVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  _Link_type p_Var10;
  ostream *poVar11;
  size_t sVar12;
  raw_ostream *prVar13;
  _Rb_tree_node_base *p_Var14;
  char *pcVar15;
  _Rb_tree_node_base *__tmp;
  _Base_ptr p_Var16;
  _Link_type p_Var17;
  _Elt_pointer puVar18;
  int iVar19;
  Module *pMVar20;
  Module *pMVar21;
  uint uVar22;
  Module *pMVar23;
  _Rb_tree_header *p_Var24;
  Module *pMVar25;
  bool bVar26;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  char ch;
  uint cur_line;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  LLVMContext context;
  ifstream ifs;
  SMDiagnostic SMD;
  ifstream ifs_1;
  char local_821;
  uint local_820;
  uint local_81c;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_818;
  Module *local_7e8;
  Module *local_7e0;
  _Head_base<0UL,_llvm::Module_*,_false> local_7d8;
  LLVMContext local_7d0 [8];
  code *local_7c8;
  uint *puStack_7c0;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> local_7b8 [6];
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined1 *local_598;
  undefined8 local_590;
  undefined1 local_588;
  undefined7 uStack_587;
  undefined8 local_578;
  undefined4 local_570;
  undefined1 *local_568;
  undefined8 local_560;
  undefined1 local_558;
  undefined7 uStack_557;
  undefined1 *local_548;
  undefined8 local_540;
  undefined1 local_538;
  undefined7 uStack_537;
  void *local_528;
  undefined8 uStack_520;
  long local_518;
  SmallVector<llvm::SMFixIt,_4U> local_510;
  uint local_438;
  undefined4 uStack_434;
  _Rb_tree_node_base local_430;
  Module *local_410;
  
  llvm::cl::ParseCommandLineOptions
            (argc,argv,(StringRef)ZEXT816(0x105038),(raw_ostream *)0x0,(char *)0x0,false);
  llvm::LLVMContext::LLVMContext(local_7d0);
  local_598 = &local_588;
  local_5a8 = 0;
  uStack_5a0 = 0;
  local_590 = 0;
  local_588 = 0;
  local_578 = 0;
  local_570 = 0;
  local_568 = &local_558;
  local_560 = 0;
  local_558 = 0;
  local_548 = &local_538;
  local_540 = 0;
  local_538 = 0;
  local_528 = (void *)0x0;
  uStack_520 = 0;
  local_518 = 0;
  local_510.super_SmallVectorImpl<llvm::SMFixIt>.super_SmallVectorTemplateBase<llvm::SMFixIt,_false>
  .super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase<unsigned_int>.BeginX =
       &local_510.super_SmallVectorStorage<llvm::SMFixIt,_4U>;
  local_510.super_SmallVectorImpl<llvm::SMFixIt>.super_SmallVectorTemplateBase<llvm::SMFixIt,_false>
  .super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase<unsigned_int>.Size = 0
  ;
  local_510.super_SmallVectorImpl<llvm::SMFixIt>.super_SmallVectorTemplateBase<llvm::SMFixIt,_false>
  .super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase<unsigned_int>.Capacity
       = 4;
  local_7c8 = llvm::function_ref<llvm::Optional<std::__cxx11::string>(llvm::StringRef)>::
              callback_fn<llvm::__0>;
  puStack_7c0 = &local_438;
  llvm::parseIRFile(&local_7d8,inputFile_abi_cxx11_._128_8_,inputFile_abi_cxx11_._136_8_,&local_5a8,
                    local_7d0);
  if (local_7d8._M_head_impl == (Module *)0x0) {
    prVar13 = (raw_ostream *)llvm::errs();
    Str.Length = 0x10;
    Str.Data = "Failed parsing \'";
    prVar13 = llvm::raw_ostream::operator<<(prVar13,Str);
    prVar13 = (raw_ostream *)llvm::raw_ostream::write((char *)prVar13,inputFile_abi_cxx11_._128_8_);
    Str_00.Length = 8;
    Str_00.Data = "\' file:\n";
    llvm::raw_ostream::operator<<(prVar13,Str_00);
    prVar13 = (raw_ostream *)*argv;
    bVar26 = (bool)llvm::errs();
    iVar19 = 1;
    llvm::SMDiagnostic::print((char *)&local_5a8,prVar13,bVar26,true);
    goto LAB_00103ec1;
  }
  local_818._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_818._M_impl.super__Rb_tree_header._M_header;
  local_818._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_818._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_818._M_impl.super__Rb_tree_header._M_node_count = 0;
  pMVar6 = *(Module **)(local_7d8._M_head_impl + 0x20);
  local_818._M_impl.super__Rb_tree_header._M_header._M_right =
       local_818._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pMVar6 != local_7d8._M_head_impl + 0x18) {
    local_7e0 = local_7d8._M_head_impl + 0x18;
    do {
      pMVar20 = pMVar6 + -0x38;
      if (pMVar6 == (Module *)0x0) {
        pMVar20 = (Module *)0x0;
      }
      local_7e8 = pMVar6;
      for (pMVar25 = *(Module **)(pMVar20 + 0x50); pMVar25 != pMVar20 + 0x48;
          pMVar25 = *(Module **)(pMVar25 + 8)) {
        pMVar6 = pMVar25 + -0x18;
        if (pMVar25 == (Module *)0x0) {
          pMVar6 = (Module *)0x0;
        }
        for (pMVar23 = *(Module **)(pMVar6 + 0x30); pMVar23 != pMVar6 + 0x28;
            pMVar23 = *(Module **)(pMVar23 + 8)) {
          pMVar21 = pMVar23 + -0x18;
          if (pMVar23 == (Module *)0x0) {
            pMVar21 = (Module *)0x0;
          }
          if (*(long *)(pMVar21 + 0x30) != 0) {
            local_438 = llvm::DebugLoc::getLine();
            std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::_M_insert_unique<unsigned_int>(&local_818,&local_438);
          }
        }
      }
      pMVar6 = *(Module **)(local_7e8 + 8);
    } while (pMVar6 != local_7e0);
  }
  if (sourceFile_abi_cxx11_._136_8_ == 0) {
    for (p_Var14 = local_818._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var14 != &local_818._M_impl.super__Rb_tree_header;
        p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
    }
LAB_00103e99:
    iVar19 = 0;
  }
  else {
    std::ifstream::ifstream(&local_438,(string *)(sourceFile_abi_cxx11_ + 0x80),_S_in);
    cVar5 = std::__basic_file<char>::is_open();
    if ((cVar5 == '\0') ||
       ((*(byte *)((long)&local_430._M_right + *(long *)(CONCAT44(uStack_434,local_438) + -0x18)) &
        1) != 0)) {
      prVar13 = (raw_ostream *)llvm::errs();
      prVar13 = llvm::raw_ostream::operator<<(prVar13,"Failed opening given source file: ");
      prVar13 = llvm::raw_ostream::operator<<(prVar13,(string *)(sourceFile_abi_cxx11_ + 0x80));
      llvm::raw_ostream::operator<<(prVar13,"\n");
      abort();
    }
    local_820 = 1;
    local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_7b8[0]._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_7b8[0]._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_7b8[0]._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_7b8[0]._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_7b8[0]._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_7b8[0]._M_impl.super__Deque_impl_data._M_map_size = 0;
    std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map(local_7b8,0);
    plVar7 = (long *)std::istream::get((char *)&local_438);
    if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) == 0) {
      do {
        if (local_821 == '}') {
          if (local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_first) {
            matching_braces.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start
            [local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x7f]].second =
                 local_820;
            operator_delete(local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
            local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_first + 0x80;
            local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_first + 0x7f;
            local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            puVar1 = local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            matching_braces.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[*puVar1].second = local_820;
          }
        }
        else if (local_821 == '{') {
          local_81c = (uint)((ulong)((long)matching_braces.
                                           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)matching_braces.
                                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3);
          if (local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<unsigned_int,_std::allocator<unsigned_int>_>::_M_push_back_aux<unsigned_int>
                      ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)local_7b8,&local_81c);
          }
          else {
            *local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_cur = local_81c;
            local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
          local_81c = 0;
          std::
          vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
          ::emplace_back<unsigned_int&,int>
                    ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                      *)&matching_braces,&local_820,(int *)&local_81c);
        }
        else if ((local_821 == '\n') &&
                (local_820 = local_820 + 1,
                local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                local_7b8[0]._M_impl.super__Deque_impl_data._M_start._M_cur)) {
          puVar18 = local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_first) {
            puVar18 = local_7b8[0]._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
          }
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
          ::_M_emplace_unique<unsigned_int&,unsigned_int&>
                    ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                      *)&nesting_structure,&local_820,puVar18 + -1);
        }
        plVar7 = (long *)std::istream::get((char *)&local_438);
      } while ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) == 0);
    }
    std::ifstream::close();
    std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(local_7b8);
    std::ifstream::~ifstream
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&local_438);
    do {
      local_7e8 = (Module *)local_818._M_impl.super__Rb_tree_header._M_node_count;
      local_430._M_color = _S_red;
      local_430._M_parent = (_Base_ptr)0x0;
      local_430._M_left = &local_430;
      local_410 = (Module *)0x0;
      p_Var9 = local_818._M_impl.super__Rb_tree_header._M_header._M_left;
      local_430._M_right = local_430._M_left;
      if ((_Rb_tree_header *)local_818._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_818._M_impl.super__Rb_tree_header) {
        do {
          local_7b8[0]._M_impl.super__Deque_impl_data._M_map =
               (_Map_pointer)
               CONCAT44(local_7b8[0]._M_impl.super__Deque_impl_data._M_map._4_4_,p_Var9[1]._M_color)
          ;
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&local_438,(uint *)local_7b8);
          ppVar2 = matching_braces.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          p_Var8 = &nesting_structure._M_t._M_impl.super__Rb_tree_header._M_header;
          if (nesting_structure._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
              (_Base_ptr)0x0) {
            p_Var8 = &nesting_structure._M_t._M_impl.super__Rb_tree_header._M_header;
            p_Var16 = nesting_structure._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            do {
              bVar26 = p_Var16[1]._M_color <
                       (_Rb_tree_color)local_7b8[0]._M_impl.super__Deque_impl_data._M_map;
              if (!bVar26) {
                p_Var8 = p_Var16;
              }
              p_Var16 = (&p_Var16->_M_left)[bVar26];
            } while (p_Var16 != (_Base_ptr)0x0);
          }
          p_Var16 = &nesting_structure._M_t._M_impl.super__Rb_tree_header._M_header;
          if (((_Rb_tree_header *)p_Var8 != &nesting_structure._M_t._M_impl.super__Rb_tree_header)
             && (p_Var16 = p_Var8,
                (_Rb_tree_color)local_7b8[0]._M_impl.super__Deque_impl_data._M_map <
                p_Var8[1]._M_color)) {
            p_Var16 = &nesting_structure._M_t._M_impl.super__Rb_tree_header._M_header;
          }
          if ((_Rb_tree_header *)p_Var16 != &nesting_structure._M_t._M_impl.super__Rb_tree_header) {
            uVar22 = *(uint *)&p_Var16[1].field_0x4;
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)&local_438,
                       &matching_braces.
                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar22].first);
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)&local_438,&ppVar2[uVar22].second);
          }
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        } while ((_Rb_tree_header *)p_Var9 != &local_818._M_impl.super__Rb_tree_header);
      }
      p_Var4 = local_430._M_parent;
      sVar3 = local_818._M_impl.super__Rb_tree_header._M_node_count;
      p_Var16 = local_818._M_impl.super__Rb_tree_header._M_header._M_right;
      p_Var8 = local_818._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var9 = local_818._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var24 = &local_818._M_impl.super__Rb_tree_header;
      if ((_Link_type)local_818._M_impl.super__Rb_tree_header._M_header._M_parent == (_Link_type)0x0
         ) {
        if ((_Link_type)local_430._M_parent != (_Link_type)0x0) {
          local_818._M_impl.super__Rb_tree_header._M_header._M_color = local_430._M_color;
          local_818._M_impl.super__Rb_tree_header._M_header._M_parent = local_430._M_parent;
          local_818._M_impl.super__Rb_tree_header._M_header._M_left = local_430._M_left;
          local_818._M_impl.super__Rb_tree_header._M_header._M_right = local_430._M_right;
          ((_Rb_tree_node_base *)&(local_430._M_parent)->_M_color)->_M_parent = &p_Var24->_M_header;
          local_818._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_410;
          local_430._M_parent = (_Base_ptr)0x0;
          local_430._M_left = &local_430;
          local_410 = (Module *)0x0;
          local_430._M_right = local_430._M_left;
        }
      }
      else if ((_Link_type)local_430._M_parent == (_Link_type)0x0) {
        local_430._M_color = local_818._M_impl.super__Rb_tree_header._M_header._M_color;
        local_430._M_parent = local_818._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_430._M_left = local_818._M_impl.super__Rb_tree_header._M_header._M_left;
        local_430._M_right = local_818._M_impl.super__Rb_tree_header._M_header._M_right;
        ((_Rb_tree_node_base *)
        &(local_818._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_color)->_M_parent =
             &local_430;
        local_410 = (Module *)local_818._M_impl.super__Rb_tree_header._M_node_count;
        local_818._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_818._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_818._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var24->_M_header;
        local_818._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var24->_M_header;
      }
      else {
        local_818._M_impl.super__Rb_tree_header._M_header._M_parent = local_430._M_parent;
        local_430._M_parent = p_Var9;
        local_818._M_impl.super__Rb_tree_header._M_header._M_left = local_430._M_left;
        local_818._M_impl.super__Rb_tree_header._M_header._M_right = local_430._M_right;
        local_430._M_left = p_Var8;
        local_430._M_right = p_Var16;
        ((_Rb_tree_node_base *)&p_Var4->_M_color)->_M_parent = &p_Var24->_M_header;
        ((_Rb_tree_node_base *)&p_Var9->_M_color)->_M_parent = &local_430;
        local_818._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_410;
        local_410 = (Module *)sVar3;
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)&local_438,(_Link_type)local_430._M_parent);
    } while (local_7e8 < local_818._M_impl.super__Rb_tree_header._M_node_count);
    std::ifstream::ifstream(local_7b8,(string *)(sourceFile_abi_cxx11_ + 0x80),_S_in);
    cVar5 = std::__basic_file<char>::is_open();
    if ((cVar5 == '\0') ||
       ((*(byte *)((long)&local_7b8[0]._M_impl.super__Deque_impl_data._M_start._M_last +
                  (long)local_7b8[0]._M_impl.super__Deque_impl_data._M_map[-3]) & 1) != 0)) {
      prVar13 = (raw_ostream *)llvm::errs();
      Str_01.Length = 0x22;
      Str_01.Data = "Failed opening given source file: ";
      prVar13 = llvm::raw_ostream::operator<<(prVar13,Str_01);
      prVar13 = (raw_ostream *)
                llvm::raw_ostream::write((char *)prVar13,sourceFile_abi_cxx11_._128_8_);
      Str_02.Length = 1;
      Str_02.Data = "\n";
      llvm::raw_ostream::operator<<(prVar13,Str_02);
      iVar19 = 1;
      bVar26 = false;
    }
    else {
      puVar1 = local_7b8[0]._M_impl.super__Deque_impl_data._M_map[-3];
      if ((*(byte *)((long)&local_7b8[0]._M_impl.super__Deque_impl_data._M_start._M_last +
                    (long)puVar1) & 2) == 0) {
        uVar22 = 1;
        do {
          std::ios::widen((char)(&stack0xfffffffffffff7c8 + (long)puVar1) + -0x80);
          std::istream::getline((char *)local_7b8,(long)&local_438,'\0');
          p_Var10 = (_Link_type)p_Var24;
          for (p_Var17 = (_Link_type)local_818._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var17 != (_Link_type)0x0;
              p_Var17 = *(_Link_type *)(&p_Var17->_M_storage + (ulong)bVar26 * 2 + -4)) {
            bVar26 = (uint)*(size_t *)(p_Var17->_M_storage)._M_storage < uVar22;
            if (!bVar26) {
              p_Var10 = p_Var17;
            }
          }
          p_Var17 = (_Link_type)p_Var24;
          if (((_Rb_tree_header *)p_Var10 != p_Var24) &&
             (p_Var17 = p_Var10, uVar22 < (uint)*(size_t *)(p_Var10->_M_storage)._M_storage)) {
            p_Var17 = (_Link_type)p_Var24;
          }
          if ((_Rb_tree_header *)p_Var17 != p_Var24) {
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,": ",2);
            sVar12 = strlen((char *)&local_438);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)&local_438,sVar12);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          }
          puVar1 = local_7b8[0]._M_impl.super__Deque_impl_data._M_map[-3];
          if ((*(byte *)((long)&local_7b8[0]._M_impl.super__Deque_impl_data._M_start._M_last +
                        (long)puVar1) & 1) != 0) {
            pcVar15 = (char *)llvm::errs();
            if ((ulong)(*(long *)(pcVar15 + 0x18) - (long)*(char **)(pcVar15 + 0x20)) < 0x11) {
              llvm::raw_ostream::write(pcVar15,0x1050a6);
            }
            else {
              builtin_strncpy(*(char **)(pcVar15 + 0x20),"An error occured\n",0x11);
              *(long *)(pcVar15 + 0x20) = *(long *)(pcVar15 + 0x20) + 0x11;
            }
            break;
          }
          uVar22 = uVar22 + 1;
        } while ((*(byte *)((long)&local_7b8[0]._M_impl.super__Deque_impl_data._M_start._M_last +
                           (long)puVar1) & 2) == 0);
      }
      std::ifstream::close();
      iVar19 = 0;
      bVar26 = true;
    }
    std::ifstream::~ifstream(local_7b8);
    if (bVar26) goto LAB_00103e99;
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::_M_erase(&local_818,(_Link_type)local_818._M_impl.super__Rb_tree_header._M_header._M_parent);
LAB_00103ec1:
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr
            ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)&local_7d8);
  llvm::SmallVector<llvm::SMFixIt,_4U>::~SmallVector(&local_510);
  if (local_528 != (void *)0x0) {
    operator_delete(local_528,local_518 - (long)local_528);
  }
  if (local_548 != &local_538) {
    operator_delete(local_548,CONCAT71(uStack_537,local_538) + 1);
  }
  if (local_568 != &local_558) {
    operator_delete(local_568,CONCAT71(uStack_557,local_558) + 1);
  }
  if (local_598 != &local_588) {
    operator_delete(local_598,CONCAT71(uStack_587,local_588) + 1);
  }
  llvm::LLVMContext::~LLVMContext(local_7d0);
  return iVar19;
}

Assistant:

int main(int argc, char *argv[]) {
    llvm::cl::ParseCommandLineOptions(argc, argv);

    llvm::LLVMContext context;
    llvm::SMDiagnostic SMD;

    std::unique_ptr<llvm::Module> M =
            llvm::parseIRFile(inputFile, SMD, context);
    if (!M) {
        llvm::errs() << "Failed parsing '" << inputFile << "' file:\n";
        SMD.print(argv[0], llvm::errs());
        return 1;
    }

    // FIXME find out if we have debugging info at all
    // no difficult machineris - just find out
    // which lines are in our module and print them
    std::set<unsigned> lines;
    get_lines_from_module(*M, lines);

    if (sourceFile.empty())
        print_lines_numbers(lines);
    else {
        get_nesting_structure(sourceFile);
        /* fill in the lines with braces */
        /* really not efficient, but easy */
        size_t old_size;
        do {
            old_size = lines.size();
            std::set<unsigned> new_lines;

            for (unsigned i : lines) {
                new_lines.insert(i);
                auto it = nesting_structure.find(i);
                if (it != nesting_structure.end()) {
                    auto &pr = matching_braces[it->second];
                    new_lines.insert(pr.first);
                    new_lines.insert(pr.second);
                }
            }

            lines.swap(new_lines);
        } while (lines.size() > old_size);

        std::ifstream ifs(sourceFile);
        if (!ifs.is_open() || ifs.bad()) {
            llvm::errs() << "Failed opening given source file: " << sourceFile
                         << "\n";
            return 1;
        }

        // print_lines_numbers(lines);
        print_lines(ifs, lines);
        ifs.close();
    }

    return 0;
}